

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O2

void __thiscall FScanner::OpenFile(FScanner *this,char *name)

{
  int iVar1;
  BYTE *filebuf;
  FString FStack_28;
  BYTE *local_20;
  
  Close(this);
  iVar1 = M_ReadFile(name,&local_20);
  FString::FString(&FStack_28,(char *)local_20,(long)iVar1);
  FString::operator=(&this->ScriptBuffer,&FStack_28);
  FString::~FString(&FStack_28);
  if (local_20 != (BYTE *)0x0) {
    operator_delete__(local_20);
  }
  FString::operator=(&this->ScriptName,name);
  this->LumpNum = -1;
  PrepareScript(this);
  return;
}

Assistant:

void FScanner::OpenFile (const char *name)
{
	BYTE *filebuf;
	int filesize;

	Close ();
	filesize = M_ReadFile (name, &filebuf);
	ScriptBuffer = FString((const char *)filebuf, filesize);
	delete[] filebuf;
	ScriptName = name;	// This is used for error messages so the full file name is preferable
	LumpNum = -1;
	PrepareScript ();
}